

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qstringbuilder.h
# Opt level: O3

QString * __thiscall
QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QString_&,_QLatin1String>,_QString_&>,_char16_t>,_QString>
::convertTo<QString>
          (QString *__return_storage_ptr__,
          QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QString_&,_QLatin1String>,_QString_&>,_char16_t>,_QString>
          *this)

{
  QLatin1String *pQVar1;
  QChar *pQVar2;
  long lVar3;
  long lVar4;
  long lVar5;
  long lVar6;
  QString *pQVar7;
  char16_t *__src;
  char16_t *pcVar8;
  
  lVar3 = (((this->a).a.a.a)->d).size;
  lVar4 = (this->a).a.a.b.m_size;
  lVar5 = (((this->a).a.b)->d).size;
  lVar6 = (this->b).d.size;
  (__return_storage_ptr__->d).size = (qsizetype)&DAT_aaaaaaaaaaaaaaaa;
  (__return_storage_ptr__->d).d = (Data *)&DAT_aaaaaaaaaaaaaaaa;
  (__return_storage_ptr__->d).ptr = (char16_t *)&DAT_aaaaaaaaaaaaaaaa;
  QString::QString(__return_storage_ptr__,lVar6 + lVar3 + lVar4 + lVar5 + 1,Uninitialized);
  pcVar8 = (__return_storage_ptr__->d).ptr;
  pQVar7 = (this->a).a.a.a;
  lVar3 = (pQVar7->d).size;
  if (lVar3 != 0) {
    __src = (pQVar7->d).ptr;
    if (__src == (char16_t *)0x0) {
      __src = (char16_t *)&QString::_empty;
    }
    memcpy(pcVar8,__src,lVar3 * 2);
  }
  pQVar2 = (QChar *)(pcVar8 + lVar3);
  pQVar1 = &(this->a).a.a.b;
  lVar3 = pQVar1->m_size;
  QAbstractConcatenable::appendLatin1To(*pQVar1,pQVar2);
  pQVar2 = pQVar2 + lVar3;
  pQVar7 = (this->a).a.b;
  lVar3 = (pQVar7->d).size;
  if (lVar3 != 0) {
    pcVar8 = (pQVar7->d).ptr;
    if (pcVar8 == (char16_t *)0x0) {
      pcVar8 = (char16_t *)&QString::_empty;
    }
    memcpy(pQVar2,pcVar8,lVar3 * 2);
  }
  pQVar2[lVar3].ucs = (this->a).b;
  lVar4 = (this->b).d.size;
  if (lVar4 != 0) {
    pcVar8 = (this->b).d.ptr;
    if (pcVar8 == (char16_t *)0x0) {
      pcVar8 = (char16_t *)&QString::_empty;
    }
    memcpy(pQVar2 + lVar3 + 1,pcVar8,lVar4 * 2);
  }
  return __return_storage_ptr__;
}

Assistant:

T convertTo() const
    {
        if (isNull()) {
            // appending two null strings must give back a null string,
            // so we're special casing this one out, QTBUG-114206
            return T();
        }

        const qsizetype len = Concatenable::size(*this);
        T s(len, Qt::Uninitialized);

        // Using data_ptr() here (private API) so we can bypass the
        // isDetached() and the replacement of a null pointer with _empty in
        // both QString and QByteArray's data() and constData(). The result is
        // the same if len != 0.
        auto d = reinterpret_cast<typename T::iterator>(s.data_ptr().data());
        const auto start = d;
        Concatenable::appendTo(*this, d);

        if constexpr (Concatenable::ExactSize) {
            Q_UNUSED(start)
        } else {
            if (len != d - start) {
                // this resize is necessary since we allocate a bit too much
                // when dealing with variable sized 8-bit encodings
                s.resize(d - start);
            }
        }
        return s;
    }